

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

QString * __thiscall
QSQLiteDriver::escapeIdentifier
          (QString *__return_storage_ptr__,QSQLiteDriver *this,QString *identifier,
          IdentifierType type)

{
  char cVar1;
  bool bVar2;
  qsizetype qVar3;
  char16_t *pcVar4;
  QSQLiteDriverPrivate *pQVar5;
  char16_t *pcVar6;
  long lVar7;
  long in_FS_OFFSET;
  QStringView identifier_00;
  QStringView identifier_01;
  QStringView local_b8;
  undefined1 local_a8 [24];
  QStringView local_90;
  QStringView local_80;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QStringView_&,_QStringView_&>,_const_QStringView_&>,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>
  local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((identifier->d).size == 0) ||
     (cVar1 = (**(code **)(*(long *)this + 0xf0))(this,identifier,type), cVar1 != '\0')) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&identifier->d);
      return __return_storage_ptr__;
    }
    goto LAB_00114f82;
  }
  pQVar5 = (QSQLiteDriverPrivate *)identifier;
  qVar3 = QString::indexOf(identifier,(QChar)0x2e,0,CaseSensitive);
  if (qVar3 < 0) {
LAB_00114f08:
    local_70.a.a.a.a.a.a = (QStringView *)CONCAT62(local_70.a.a.a.a.a.a._2_6_,0x22);
    local_70.a.a.a.a.b = (QStringView *)CONCAT62(local_70.a.a.a.a.b._2_6_,0x22);
    local_70.a.a.a.a.a.b = (QStringView *)identifier;
    QStringBuilder<QStringBuilder<char16_t,_const_QString_&>,_char16_t>::convertTo<QString>
              (__return_storage_ptr__,
               (QStringBuilder<QStringBuilder<char16_t,_const_QString_&>,_char16_t> *)&local_70);
  }
  else {
    local_80.m_data = (identifier->d).ptr;
    lVar7 = (identifier->d).size - (qVar3 + 1);
    pcVar4 = local_80.m_data + qVar3 + 1;
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    identifier_00.m_data = local_80.m_data;
    identifier_00.m_size = qVar3;
    local_90.m_size = lVar7;
    local_90.m_data = pcVar4;
    local_80.m_size = qVar3;
    bVar2 = QSQLiteDriverPrivate::isIdentifierEscaped(pQVar5,identifier_00);
    pcVar6 = L"\"";
    local_70.a.a.a.a.a.a = (QStringView *)0x1e1610;
    if (bVar2) {
      local_70.a.a.a.a.a.a = (QStringView *)0x1e1612;
    }
    pQVar5 = (QSQLiteDriverPrivate *)local_a8;
    QStringView::QStringView<const_char16_t_*,_true>((QStringView *)pQVar5,(char16_t **)&local_70);
    local_b8.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.m_data = (storage_type *)&DAT_aaaaaaaaaaaaaaaa;
    identifier_01.m_data = pcVar4;
    identifier_01.m_size = lVar7;
    bVar2 = QSQLiteDriverPrivate::isIdentifierEscaped(pQVar5,identifier_01);
    if (bVar2) {
      pcVar6 = L"";
    }
    local_70.a.a.a.a.a.a = (QStringView *)pcVar6;
    QStringView::QStringView<const_char16_t_*,_true>(&local_b8,(char16_t **)&local_70);
    if (((undefined1 *)local_a8._0_8_ != (undefined1 *)0x0) &&
       ((undefined1 *)local_b8.m_size != (undefined1 *)0x0)) goto LAB_00114f08;
    local_70.a.a.a.a.a.b = &local_80;
    local_70.a.a.a.b = L'.';
    local_70.a.b = &local_90;
    local_70.a.a.a.a.a.a = (QStringView *)local_a8;
    local_70.a.a.a.a.b = (QStringView *)local_a8;
    local_70.a.a.b = &local_b8;
    local_70.b = &local_b8;
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QStringView_&,_QStringView_&>,_const_QStringView_&>,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>
    ::convertTo<QString>(__return_storage_ptr__,&local_70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00114f82:
  __stack_chk_fail();
}

Assistant:

QString QSQLiteDriver::escapeIdentifier(const QString &identifier, IdentifierType type) const
{
    Q_D(const QSQLiteDriver);
    if (identifier.isEmpty() || isIdentifierEscaped(identifier, type))
        return identifier;

    const auto indexOfSeparator = identifier.indexOf(u'.');
    if (indexOfSeparator > -1) {
        auto leftName = QStringView{identifier}.first(indexOfSeparator);
        auto rightName = QStringView{identifier}.sliced(indexOfSeparator + 1);
        const QStringView leftEnclose = d->isIdentifierEscaped(leftName) ? u"" : u"\"";
        const QStringView rightEnclose = d->isIdentifierEscaped(rightName) ? u"" : u"\"";
        if (leftEnclose.isEmpty() || rightEnclose.isEmpty())
            return (leftEnclose + leftName + leftEnclose + u'.' + rightEnclose + rightName
                    + rightEnclose);
    }
    return u'"' + identifier + u'"';
}